

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WFXMLScanner.cpp
# Opt level: O0

void __thiscall xercesc_4_0::WFXMLScanner::scanCharData(WFXMLScanner *this,XMLBuffer *toUse)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  XMLReader *this_00;
  EndOfEntityException *toCatch;
  XMLCh tmpBuf [9];
  undefined1 local_58 [8];
  ThrowEOEJanitor jan_1;
  byte local_31;
  int local_30;
  XMLCh XStack_2c;
  bool notDone;
  bool gotLeadingSurrogate;
  bool escaped;
  States curState;
  XMLCh secondCh;
  XMLCh nextCh;
  ThrowEOEJanitor jan;
  XMLBuffer *toUse_local;
  WFXMLScanner *this_local;
  
  jan.fMgr = (ReaderMgr *)toUse;
  XMLBuffer::reset(toUse);
  ThrowEOEJanitor::ThrowEOEJanitor
            ((ThrowEOEJanitor *)&curState,&(this->super_XMLScanner).fReaderMgr,true);
  XStack_2c = L'\0';
  local_30 = 0;
  local_31 = 0;
  bVar1 = false;
  bVar2 = true;
  do {
    if (!bVar2) {
      (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0x10])
                (this,jan.fMgr);
      ThrowEOEJanitor::~ThrowEOEJanitor((ThrowEOEJanitor *)&curState);
      return;
    }
LAB_0037b482:
    if ((local_30 == 0) && (!bVar1)) {
      ReaderMgr::movePlainContentChars(&(this->super_XMLScanner).fReaderMgr,(XMLBuffer *)jan.fMgr);
    }
    bVar2 = ReaderMgr::getNextCharIfNot
                      (&(this->super_XMLScanner).fReaderMgr,L'<',(XMLCh *)&gotLeadingSurrogate);
    if (bVar2) {
      local_31 = 0;
      if (_gotLeadingSurrogate == L'&') break;
      if (((ushort)_gotLeadingSurrogate < 0xd800) || (0xdbff < (ushort)_gotLeadingSurrogate)) {
        if (((ushort)_gotLeadingSurrogate < 0xdc00) || (0xdfff < (ushort)_gotLeadingSurrogate)) {
          if (bVar1) {
            XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
          }
          else {
            this_00 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
            bVar2 = XMLReader::isXMLChar(this_00,_gotLeadingSurrogate);
            if (!bVar2) {
              XMLString::binToText
                        ((uint)(ushort)_gotLeadingSurrogate,(XMLCh *)&toCatch,8,0x10,
                         (this->super_XMLScanner).fMemoryManager);
              XMLScanner::emitError
                        (&this->super_XMLScanner,InvalidCharacter,(XMLCh *)&toCatch,(XMLCh *)0x0,
                         (XMLCh *)0x0,(XMLCh *)0x0);
            }
          }
        }
        else if (!bVar1) {
          XMLScanner::emitError(&this->super_XMLScanner,Unexpected2ndSurrogateChar);
        }
        bVar1 = false;
      }
      else if (bVar1) {
        XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
      }
      else {
        bVar1 = true;
      }
      goto LAB_0037b75c;
    }
    if (bVar1) {
      XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
    }
    bVar2 = false;
  } while( true );
  (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0x10])
            (this,jan.fMgr);
  ThrowEOEJanitor::ThrowEOEJanitor
            ((ThrowEOEJanitor *)local_58,&(this->super_XMLScanner).fReaderMgr,false);
  iVar3 = (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0xd])
                    (this,0,&gotLeadingSurrogate,&stack0xffffffffffffffd4,&local_31);
  if (iVar3 != 1) {
    bVar1 = false;
  }
  ThrowEOEJanitor::~ThrowEOEJanitor((ThrowEOEJanitor *)local_58);
  if (iVar3 == 1) {
LAB_0037b75c:
    if ((local_31 & 1) == 0) {
      if (_gotLeadingSurrogate == L']') {
        if (local_30 == 0) {
          local_30 = 1;
        }
        else if (local_30 == 1) {
          local_30 = 2;
        }
      }
      else {
        if ((_gotLeadingSurrogate == L'>') && (local_30 == 2)) {
          XMLScanner::emitError(&this->super_XMLScanner,BadSequenceInCharData);
        }
        local_30 = 0;
      }
    }
    else {
      local_30 = 0;
    }
    XMLBuffer::append((XMLBuffer *)jan.fMgr,_gotLeadingSurrogate);
    if (XStack_2c != L'\0') {
      XMLBuffer::append((XMLBuffer *)jan.fMgr,XStack_2c);
      XStack_2c = L'\0';
    }
  }
  goto LAB_0037b482;
}

Assistant:

void WFXMLScanner::scanCharData(XMLBuffer& toUse)
{
    //  We have to watch for the stupid ]]> sequence, which is illegal in
    //  character data. So this is a little state machine that handles that.
    enum States
    {
        State_Waiting
        , State_GotOne
        , State_GotTwo
    };

    // Reset the buffer before we start
    toUse.reset();

    // Turn on the 'throw at end' flag of the reader manager
    ThrowEOEJanitor jan(&fReaderMgr, true);

    //  In order to be more efficient we have to use kind of a deeply nested
    //  set of blocks here. The outer block puts on a try and catches end of
    //  entity exceptions. The inner loop is the per-character loop. If we
    //  put the try inside the inner loop, it would work but would require
    //  the exception handling code setup/teardown code to be invoked for
    //  each character.
    XMLCh   nextCh;
    XMLCh   secondCh = 0;
    States  curState = State_Waiting;
    bool    escaped = false;
    bool    gotLeadingSurrogate = false;
    bool    notDone = true;
    while (notDone)
    {
        try
        {
            while (true)
            {
                //  Eat through as many plain content characters as possible without
                //  needing special handling.  Moving most content characters here,
                //  in this one call, rather than running the overall loop once
                //  per content character, is a speed optimization.
                if (curState == State_Waiting  &&  !gotLeadingSurrogate)
                {
                     fReaderMgr.movePlainContentChars(toUse);
                }

                // Try to get another char from the source
                //   The code from here on down covers all contengencies,
                if (!fReaderMgr.getNextCharIfNot(chOpenAngle, nextCh))
                {
                    // If we were waiting for a trailing surrogate, its an error
                    if (gotLeadingSurrogate)
                        emitError(XMLErrs::Expected2ndSurrogateChar);

                    notDone = false;
                    break;
                }

                //  Watch for a reference. Note that the escapement mechanism
                //  is ignored in this content.
                escaped = false;
                if (nextCh == chAmpersand)
                {
                    sendCharData(toUse);

                    // Turn off the throwing at the end of entity during this
                    ThrowEOEJanitor jan(&fReaderMgr, false);

                    if (scanEntityRef(false, nextCh, secondCh, escaped) != EntityExp_Returned)
                    {
                        gotLeadingSurrogate = false;
                        continue;
                    }
                }
                else if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
                {
                    // Deal with surrogate pairs
                    //  Its a leading surrogate. If we already got one, then
                    //  issue an error, else set leading flag to make sure that
                    //  we look for a trailing next time.
                    if (gotLeadingSurrogate)
                    {
                        emitError(XMLErrs::Expected2ndSurrogateChar);
                    }
                    else
                        gotLeadingSurrogate = true;
                }
                else
                {
                    //  If its a trailing surrogate, make sure that we are
                    //  prepared for that. Else, its just a regular char so make
                    //  sure that we were not expected a trailing surrogate.
                    if ((nextCh >= 0xDC00) && (nextCh <= 0xDFFF))
                    {
                        // Its trailing, so make sure we were expecting it
                        if (!gotLeadingSurrogate)
                            emitError(XMLErrs::Unexpected2ndSurrogateChar);
                    }
                    else
                    {
                        //  Its just a char, so make sure we were not expecting a
                        //  trailing surrogate.
                        if (gotLeadingSurrogate) {
                            emitError(XMLErrs::Expected2ndSurrogateChar);
                        }
                        // Its got to at least be a valid XML character
                        else if (!fReaderMgr.getCurrentReader()->isXMLChar(nextCh))
                        {
                            XMLCh tmpBuf[9];
                            XMLString::binToText
                            (
                                nextCh
                                , tmpBuf
                                , 8
                                , 16
                                , fMemoryManager
                            );
                            emitError(XMLErrs::InvalidCharacter, tmpBuf);
                        }
                    }
                    gotLeadingSurrogate = false;
                }

                // Keep the state machine up to date
                if (!escaped)
                {
                    if (nextCh == chCloseSquare)
                    {
                        if (curState == State_Waiting)
                            curState = State_GotOne;
                        else if (curState == State_GotOne)
                            curState = State_GotTwo;
                    }
                    else if (nextCh == chCloseAngle)
                    {
                        if (curState == State_GotTwo)
                            emitError(XMLErrs::BadSequenceInCharData);
                        curState = State_Waiting;
                    }
                    else
                    {
                        curState = State_Waiting;
                    }
                }
                else
                {
                    curState = State_Waiting;
                }

                // Add this char to the buffer
                toUse.append(nextCh);

                if (secondCh)
                {
                    toUse.append(secondCh);
                    secondCh=0;
                }
            }
        }
        catch(const EndOfEntityException& toCatch)
        {
            //  Some entity ended, so we have to send any accumulated
            //  chars and send an end of entity event.
            sendCharData(toUse);
            gotLeadingSurrogate = false;

            if (fDocHandler)
                fDocHandler->endEntityReference(toCatch.getEntity());
        }
    }

    // Send any char data that we accumulated into the buffer
    sendCharData(toUse);
}